

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

BCPos debug_framepc(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  long lVar1;
  BCPos BVar2;
  ulong uVar3;
  ulong uVar4;
  cTValue *pcVar5;
  
  BVar2 = 0xffffffff;
  if ((fn->c).ffid == '\0') {
    if (nextframe == (cTValue *)0x0) {
      uVar4 = (ulong)L->cframe & 0xfffffffffffffffc;
      if (uVar4 == 0) {
        return 0xffffffff;
      }
      uVar3 = *(ulong *)(uVar4 + 0x18);
      if (uVar3 == *(ulong *)(uVar4 + 0x10)) {
        return 0xffffffff;
      }
    }
    else {
      uVar3 = nextframe->u64;
      if ((uVar3 & 3) != 0) {
        if (((uint)uVar3 & 7) != 2) {
          uVar4 = (ulong)L->cframe & 0xfffffffffffffffc;
          pcVar5 = L->base + -1;
LAB_0010b1a4:
          do {
            if (uVar4 == 0) {
              return 0xffffffff;
            }
            while ((*(int *)(uVar4 + 8) < 0 &&
                   (pcVar5 < (cTValue *)((ulong)(uint)-*(int *)(uVar4 + 8) + (L->stack).ptr64)))) {
              uVar4 = *(ulong *)(uVar4 + 0x20) & 0xfffffffffffffffc;
              if (uVar4 == 0) {
                return 0xffffffff;
              }
            }
            if (pcVar5 < nextframe) {
              uVar3 = *(ulong *)(uVar4 + 0x18);
              if (uVar3 == 0) {
                return 0xffffffff;
              }
              goto LAB_0010b173;
            }
            uVar3 = pcVar5->u64;
            if (((uint)uVar3 & 3) == 1) {
LAB_0010b20d:
              uVar4 = *(ulong *)(uVar4 + 0x20) & 0xfffffffffffffffc;
            }
            else {
              if ((uVar3 & 3) == 0) {
                pcVar5 = pcVar5 + (-2 - (ulong)*(byte *)(uVar3 - 3));
                goto LAB_0010b1a4;
              }
              if ((((uint)uVar3 & 7) == 2) && (pcVar5[-3].u64 == 1)) goto LAB_0010b20d;
            }
            pcVar5 = (cTValue *)((long)pcVar5 - (uVar3 & 0xfffffffffffffff8));
          } while( true );
        }
        uVar3 = nextframe[-2].u64;
      }
    }
LAB_0010b173:
    lVar1 = *(long *)((long)fn + 0x20);
    BVar2 = (int)(uVar3 - lVar1 >> 2) - 1;
    if (*(uint *)(lVar1 + -0x5c) < BVar2) {
      return (BCPos)((ulong)(*(long *)(uVar3 - 0xc) - lVar1) >> 2);
    }
  }
  return BVar2;
}

Assistant:

static BCPos debug_framepc(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  const BCIns *ins;
  GCproto *pt;
  BCPos pos;
  lj_assertL(fn->c.gct == ~LJ_TFUNC || fn->c.gct == ~LJ_TTHREAD,
	     "function or frame expected");
  if (!isluafunc(fn)) {  /* Cannot derive a PC for non-Lua functions. */
    return NO_BCPOS;
  } else if (nextframe == NULL) {  /* Lua function on top. */
    void *cf = cframe_raw(L->cframe);
    if (cf == NULL || (char *)cframe_pc(cf) == (char *)cframe_L(cf))
      return NO_BCPOS;
    ins = cframe_pc(cf);  /* Only happens during error/hook handling. */
  } else {
    if (frame_islua(nextframe)) {
      ins = frame_pc(nextframe);
    } else if (frame_iscont(nextframe)) {
      ins = frame_contpc(nextframe);
    } else {
      /* Lua function below errfunc/gc/hook: find cframe to get the PC. */
      void *cf = cframe_raw(L->cframe);
      TValue *f = L->base-1;
      for (;;) {
	if (cf == NULL)
	  return NO_BCPOS;
	while (cframe_nres(cf) < 0) {
	  if (f >= restorestack(L, -cframe_nres(cf)))
	    break;
	  cf = cframe_raw(cframe_prev(cf));
	  if (cf == NULL)
	    return NO_BCPOS;
	}
	if (f < nextframe)
	  break;
	if (frame_islua(f)) {
	  f = frame_prevl(f);
	} else {
	  if (frame_isc(f) || (frame_iscont(f) && frame_iscont_fficb(f)))
	    cf = cframe_raw(cframe_prev(cf));
	  f = frame_prevd(f);
	}
      }
      ins = cframe_pc(cf);
      if (!ins) return NO_BCPOS;
    }
  }
  pt = funcproto(fn);
  pos = proto_bcpos(pt, ins) - 1;
#if LJ_HASJIT
  if (pos > pt->sizebc) {  /* Undo the effects of lj_trace_exit for JLOOP. */
    GCtrace *T = (GCtrace *)((char *)(ins-1) - offsetof(GCtrace, startins));
    lj_assertL(bc_isret(bc_op(ins[-1])), "return bytecode expected");
    pos = proto_bcpos(pt, mref(T->startpc, const BCIns));
  }
#endif
  return pos;
}